

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O2

bool FileExpand::unexpand
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  pointer puVar6;
  
  bVar4 = checkIfExpanded(in);
  if (bVar4) {
    puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (ulong)(*(int *)(puVar1 + 8) + -1 + *(uint *)(puVar1 + 0xc)) /
            (ulong)*(uint *)(puVar1 + 0xc);
    puVar6 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar6) {
      (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar6;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (out,(ulong)*(uint *)(puVar1 + 4));
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (uVar2 <= uVar5) break;
      puVar6 = puVar1 + 0x20;
      if (uVar5 != 0) {
        puVar6 = puVar1 + *(uint *)(puVar1 + 0xc) * uVar5;
      }
      bVar4 = inflate(out,puVar6 + 0x10,(ulong)*(uint *)(puVar6 + 8));
      uVar3 = uVar5 + 1;
    } while (bVar4);
    bVar4 = (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start == (ulong)*(uint *)(puVar1 + 4) && uVar2 <= uVar5
    ;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool FileExpand::unexpand(const std::vector<uint8_t>& in, std::vector<uint8_t>& out)
{
	if (!checkIfExpanded(in)) {
		return false;
	}
	
	const auto superHdr = reinterpret_cast<const SuperHeader*>(in.data());
	const auto segmentCount = (superHdr->fileSize + superHdr->segmentSize - 1) / superHdr->segmentSize;

	out.clear();
	out.reserve(superHdr->decompressedFileSize);
	
	boost::iostreams::zlib_params params;
	params.window_bits = -boost::iostreams::zlib::default_window_bits;
	
	auto status = true;
	for (auto i = 0u; i < segmentCount; ++i) {
		const auto segmentHdr = (i == 0)
			? reinterpret_cast<const SegmentHeader*>(superHdr + 1)
			: reinterpret_cast<const SegmentHeader*>(reinterpret_cast<const uint8_t*>(superHdr) + static_cast<size_t>(superHdr->segmentSize) * i)
		;

		const auto segmentData = reinterpret_cast<const uint8_t*>(segmentHdr + 1);
		if (!inflate(out, segmentData, segmentHdr->zSize)) {
			status = false;
			break;
		}
	}
	
	if (out.size() != superHdr->decompressedFileSize) {
		status = false;
	}
	
	return status;
}